

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Output.c
# Opt level: O0

WJTL_STATUS TestStrings(void)

{
  WJTL_STATUS WVar1;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  WJTL_STATUS TestReturn;
  
  __result_7 = WJTL_STATUS_SUCCESS;
  WVar1 = VerifyOutputString("string","\"string\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"string\", \"\\\"string\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x102);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString(anon_var_dwarf_39d + 10,"null",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\", \"null\", 0 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x103);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString((char *)0x0,"null",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( ((void*)0), \"null\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x104);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString(" string ","\" string \"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \" string \", \"\\\" string \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x106);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString(" ","\" \"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \" \", \"\\\" \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x107);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("it\'s","\"it\'s\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"it\'s\", \"\\\"it\'s\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x108);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\n","\"\\n\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\n\", \"\\\"\\\\n\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x109);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\x01\x02\x03\x04\x05\x06\a\b",
                             "\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x01\\x02\\x03\\x04\\x05\\x06\\x07\\x08\", \"\\\"\\\\u0001\\\\u0002\\\\u0003\\\\u0004\\\\u0005\\\\u0006\\\\u0007\\\\b\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10a);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\t\n\v\f\r\x0e\x0f\x10","\"\\t\\n\\u000b\\f\\r\\u000e\\u000f\\u0010\""
                             ,false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x09\\x0a\\x0b\\x0c\\x0d\\x0e\\x0f\\x10\", \"\\\"\\\\t\\\\n\\\\u000b\\\\f\\\\r\\\\u000e\\\\u000f\\\\u0010\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10b);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\x11\x12\x13\x14\x15\x16\x17\x18",
                             "\"\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x11\\x12\\x13\\x14\\x15\\x16\\x17\\x18\", \"\\\"\\\\u0011\\\\u0012\\\\u0013\\\\u0014\\\\u0015\\\\u0016\\\\u0017\\\\u0018\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10c);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\x19\x1a\x1b\x1c\x1d\x1e\x1f ",
                             "\"\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f \"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x19\\x1a\\x1b\\x1c\\x1d\\x1e\\x1f\\x20\", \"\\\"\\\\u0019\\\\u001a\\\\u001b\\\\u001c\\\\u001d\\\\u001e\\\\u001f \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10d);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("_\"_","\"_\\\"_\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"_\\\"_\", \"\\\"_\\\\\\\"_\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10f);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("_\\_","\"_\\\\_\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"_\\\\_\", \"\\\"_\\\\\\\\_\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x110);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString(anon_var_dwarf_445,anon_var_dwarf_58a9,false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\xF0\\x9F\\x98\\x81\", \"\\\"\\xF0\\x9F\\x98\\x81\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x111);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyInvalidString(anon_var_dwarf_58cb);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyInvalidString( \"\\xF0\\x9F\\x98Truncated\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x113);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("it\'s","\'it\\\'s\'",true);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"it\'s\", \"\'it\\\\\'s\'\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x116);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  return __result_7;
}

Assistant:

static
WJTL_STATUS
    TestStrings
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( VerifyOutputString( "string", "\"string\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "", "null", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( NULL, "null", false ) );

    JL_ASSERT_SUCCESS( VerifyOutputString( " string ", "\" string \"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( " ", "\" \"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "it's", "\"it's\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\n", "\"\\n\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\x01\x02\x03\x04\x05\x06\x07\x08", "\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\x09\x0a\x0b\x0c\x0d\x0e\x0f\x10", "\"\\t\\n\\u000b\\f\\r\\u000e\\u000f\\u0010\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\x11\x12\x13\x14\x15\x16\x17\x18", "\"\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\x19\x1a\x1b\x1c\x1d\x1e\x1f\x20", "\"\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f \"", false ) );

    JL_ASSERT_SUCCESS( VerifyOutputString( "_\"_", "\"_\\\"_\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "_\\_", "\"_\\\\_\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\xF0\x9F\x98\x81", "\"\xF0\x9F\x98\x81\"", false ) );    // smiley face emoji

    JL_ASSERT_SUCCESS( VerifyInvalidString( "\xF0\x9F\x98Truncated" ) );    // utf8 sequence truncated

    // Test Json5 handling of single quote in a string when using single quotes for string
    JL_ASSERT_SUCCESS( VerifyOutputString( "it's", "'it\\'s'", true ) );

    return TestReturn;
}